

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::anon_unknown_7::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ofd,int number,int scanLineMin,
          int scanLineMax)

{
  pointer ppLVar1;
  LineBuffer *pLVar2;
  Data *pDVar3;
  int iVar4;
  int iVar5;
  
  IlmThread_2_5::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__LineBufferTask_0037b1b0;
  this->_ofd = ofd;
  ppLVar1 = (ofd->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_lineBuffer =
       ppLVar1[(ulong)(long)number %
               (ulong)((long)(ofd->lineBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3)];
  IlmThread_2_5::Semaphore::wait();
  pLVar2 = this->_lineBuffer;
  if (pLVar2->partiallyFull == true) {
    iVar5 = pLVar2->minY;
    iVar4 = pLVar2->maxY;
  }
  else {
    pLVar2->endOfLineBufferData = (pLVar2->buffer)._data;
    pDVar3 = this->_ofd;
    iVar4 = pDVar3->linesInBuffer;
    iVar5 = number * iVar4 + pDVar3->minY;
    pLVar2->minY = iVar5;
    iVar4 = iVar4 + iVar5 + -1;
    if (pDVar3->maxY < iVar4) {
      iVar4 = pDVar3->maxY;
    }
    pLVar2->maxY = iVar4;
    pLVar2->partiallyFull = true;
  }
  if (scanLineMin < iVar5) {
    scanLineMin = iVar5;
  }
  pLVar2->scanLineMin = scanLineMin;
  if (iVar4 < scanLineMax) {
    scanLineMax = iVar4;
  }
  pLVar2->scanLineMax = scanLineMax;
  return;
}

Assistant:

LineBufferTask::LineBufferTask
    (TaskGroup *group,
     OutputFile::Data *ofd,
     int number,
     int scanLineMin,
     int scanLineMax)
:
    Task (group),
    _ofd (ofd),
    _lineBuffer (_ofd->getLineBuffer(number))
{
    //
    // Wait for the lineBuffer to become available
    //

    _lineBuffer->wait ();
    
    //
    // Initialize the lineBuffer data if necessary
    //

    if (!_lineBuffer->partiallyFull)
    {
        _lineBuffer->endOfLineBufferData = _lineBuffer->buffer;

        _lineBuffer->minY = _ofd->minY + number * _ofd->linesInBuffer;

        _lineBuffer->maxY = min (_lineBuffer->minY + _ofd->linesInBuffer - 1,
				 _ofd->maxY);

        _lineBuffer->partiallyFull = true;
    }
    
    _lineBuffer->scanLineMin = max (_lineBuffer->minY, scanLineMin);
    _lineBuffer->scanLineMax = min (_lineBuffer->maxY, scanLineMax);
}